

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O0

void __thiscall spatial_region::compute_rho(spatial_region *this)

{
  cellj ***pppcVar1;
  double ***pppdVar2;
  cellp ***pppcVar3;
  int *in_RDI;
  int k_1;
  int j_1;
  int i_1;
  int n;
  int k;
  int j;
  int i;
  particle *current;
  particle *in_stack_00000158;
  spatial_region *in_stack_00000160;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar4;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  particle *local_10;
  
  for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_RDI[1]; local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < in_RDI[2]; local_1c = local_1c + 1) {
        pppcVar1 = field3d<cellj>::operator[]
                             ((field3d<cellj> *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              (int)((ulong)in_RDI >> 0x20));
        (*pppcVar1)[local_18][local_1c].jx = 0.0;
        pppcVar1 = field3d<cellj>::operator[]
                             ((field3d<cellj> *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              (int)((ulong)in_RDI >> 0x20));
        (*pppcVar1)[local_18][local_1c].jy = 0.0;
        pppcVar1 = field3d<cellj>::operator[]
                             ((field3d<cellj> *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              (int)((ulong)in_RDI >> 0x20));
        (*pppcVar1)[local_18][local_1c].jz = 0.0;
        local_20 = 0;
        while( true ) {
          if (in_RDI[0x16] <= local_20) break;
          std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::operator[]
                    ((vector<field3d<double>,_std::allocator<field3d<double>_>_> *)(in_RDI + 0x8c),
                     (long)local_20);
          pppdVar2 = field3d<double>::operator[]
                               ((field3d<double> *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                (int)((ulong)in_RDI >> 0x20));
          (*pppdVar2)[local_18][local_1c] = 0.0;
          local_20 = local_20 + 1;
        }
      }
    }
  }
  for (local_24 = 0; local_24 < *in_RDI; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < in_RDI[1]; local_28 = local_28 + 1) {
      for (iVar4 = 0; iVar4 < in_RDI[2]; iVar4 = iVar4 + 1) {
        pppcVar3 = field3d<cellp>::operator[]
                             ((field3d<cellp> *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                              (int)((ulong)in_RDI >> 0x20));
        for (local_10 = (*pppcVar3)[local_28][iVar4].pl.start; local_10 != (particle *)0x0;
            local_10 = local_10->next) {
          rhodeposition(in_stack_00000160,in_stack_00000158);
        }
      }
    }
  }
  return;
}

Assistant:

void spatial_region::compute_rho()
{
    particle* current;
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                cj[i][j][k].jx = 0;
                cj[i][j][k].jy = 0;
                cj[i][j][k].jz = 0;
                for (int n=0;n<n_ion_populations;n++)
                    irho[n][i][j][k] = 0;
            }
        }
    }
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                current = cp[i][j][k].pl.start;
                while(current!=0)
                {
                    rhodeposition(*current);
                    current = current->next;
                }
            }
        }
    }
}